

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  NeuralNetworkLayer *pNVar3;
  bool bVar4;
  long lVar5;
  LayerUnion LVar6;
  long *plVar7;
  size_type *psVar8;
  uint64_t expectedUnits;
  WeightParams *pWVar9;
  LSTMParams *pLVar10;
  LSTMWeightParams *lstmWeightParams;
  InternalMetadataWithArenaLite *pIVar11;
  long lVar12;
  bool bVar13;
  Result r;
  string err;
  BiDirectionalLSTMLayerParams recurrent;
  LSTMParams lstmParams;
  string local_1e0;
  string local_1c0;
  _func_int **local_1a0;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  NeuralNetworkLayer *local_178;
  uint64_t local_170;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  Type *local_140;
  Type *local_138;
  string local_130;
  uint64_t local_110;
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  int local_d8;
  RepeatedPtrFieldBase local_c8;
  LSTMParams *local_b0;
  uint64 local_a8;
  uint64_t local_a0;
  string local_90;
  LSTMParams local_70;
  LSTMParams local_50;
  
  Result::Result((Result *)&local_1a0);
  validateInputCount((Result *)local_108,layer,1,5);
  local_1a0 = (_func_int **)local_108;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_p != &local_f0) {
    operator_delete(local_100._M_p,
                    CONCAT44(local_f0._M_allocated_capacity._4_4_,
                             local_f0._M_allocated_capacity._0_4_) + 1);
  }
  bVar4 = Result::good((Result *)&local_1a0);
  if (bVar4) {
    validateOutputCount((Result *)local_108,layer,5,5);
    local_1a0 = (_func_int **)local_108;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,
                      CONCAT44(local_f0._M_allocated_capacity._4_4_,
                               local_f0._M_allocated_capacity._0_4_) + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_1a0);
  if (bVar4) {
    bVar4 = Result::good((Result *)&local_1a0);
    if (bVar4) {
      if (this->ndArrayInterpretation == true) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BiDirectionalLSTM","");
        validateInputOutputRankEquality((Result *)local_108,layer,&local_90,&this->blobNameToRank);
        local_1a0 = (_func_int **)local_108;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_p != &local_f0) {
          operator_delete(local_100._M_p,
                          CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                   local_f0._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_1a0);
        if (bVar4) {
          local_168 = (undefined1  [8])local_158;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,"BiDirectionalLSTM","");
          validateRankCount((Result *)local_108,layer,(string *)local_168,5,5,&this->blobNameToRank)
          ;
          local_1a0 = (_func_int **)local_108;
          std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_p != &local_f0) {
            operator_delete(local_100._M_p,
                            CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                     local_f0._M_allocated_capacity._0_4_) + 1);
          }
          if (local_168 != (undefined1  [8])local_158) {
            operator_delete((void *)local_168,local_158._0_8_ + 1);
          }
          bVar4 = Result::good((Result *)&local_1a0);
          if (bVar4) goto LAB_00544c6e;
        }
      }
      else {
LAB_00544c6e:
        local_178 = layer;
        if (layer->_oneof_case_[0] == 0x1ae) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.bidirectionallstm_ = Specification::BiDirectionalLSTMLayerParams::default_instance()
          ;
        }
        pIVar11 = &(LVar6.batchnorm_)->mean_->_internal_metadata_;
        if ((LVar6.batchnorm_)->mean_ == (WeightParams *)0x0) {
          pIVar11 = (InternalMetadataWithArenaLite *)0x0;
        }
        lVar5 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                       &(LVar6.convolution_)->kernelsize_)->super_RepeatedPtrFieldBase).
                      current_size_;
        if (lVar5 != 0) {
          lVar12 = 0;
          do {
            validateRecurrentActivationParams
                      ((Result *)local_108,
                       *(ActivationParams **)
                        ((long)&(pIVar11->
                                super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                ).ptr_ + lVar12));
            local_1a0 = (_func_int **)local_108;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_p != &local_f0) {
              operator_delete(local_100._M_p,
                              CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                       local_f0._M_allocated_capacity._0_4_) + 1);
            }
            bVar4 = Result::good((Result *)&local_1a0);
            bVar13 = lVar5 * 8 + -8 != lVar12;
            lVar12 = lVar12 + 8;
          } while (bVar4 && bVar13);
        }
        if (local_178->_oneof_case_[0] == 0x1ae) {
          LVar6 = local_178->layer_;
        }
        else {
          LVar6.bidirectionallstm_ = Specification::BiDirectionalLSTMLayerParams::default_instance()
          ;
        }
        pIVar11 = &(LVar6.gru_)->outputgateweightmatrix_->_internal_metadata_;
        if ((LVar6.gru_)->outputgateweightmatrix_ == (WeightParams *)0x0) {
          pIVar11 = (InternalMetadataWithArenaLite *)0x0;
        }
        lVar5 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                       &(LVar6.convolution_)->stride_)->super_RepeatedPtrFieldBase).current_size_;
        if (lVar5 != 0) {
          lVar12 = 0;
          do {
            validateRecurrentActivationParams
                      ((Result *)local_108,
                       *(ActivationParams **)
                        ((long)&(pIVar11->
                                super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                ).ptr_ + lVar12));
            local_1a0 = (_func_int **)local_108;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_p != &local_f0) {
              operator_delete(local_100._M_p,
                              CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                       local_f0._M_allocated_capacity._0_4_) + 1);
            }
            bVar4 = Result::good((Result *)&local_1a0);
            bVar13 = lVar5 * 8 + -8 != lVar12;
            lVar12 = lVar12 + 8;
          } while (bVar4 && bVar13);
        }
        pNVar3 = local_178;
        if (local_178->_oneof_case_[0] == 0x1a4) {
          LVar6 = local_178->layer_;
        }
        else {
          LVar6.unidirectionallstm_ =
               Specification::UniDirectionalLSTMLayerParams::default_instance();
        }
        lstmWeightParams = (LVar6.unidirectionallstm_)->weightparams_;
        if (lstmWeightParams == (LSTMWeightParams *)0x0) {
          lstmWeightParams = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_
          ;
        }
        if (pNVar3->_oneof_case_[0] == 0x1a4) {
          LVar6 = pNVar3->layer_;
        }
        else {
          LVar6.unidirectionallstm_ =
               Specification::UniDirectionalLSTMLayerParams::default_instance();
        }
        pLVar10 = (LVar6.unidirectionallstm_)->params_;
        if (pLVar10 == (LSTMParams *)0x0) {
          pLVar10 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
        }
        Specification::LSTMParams::LSTMParams(&local_70,pLVar10);
        validateLSTMWeightParams((Result *)local_108,lstmWeightParams,&local_70);
        local_1a0 = (_func_int **)local_108;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_p != &local_f0) {
          operator_delete(local_100._M_p,
                          CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                   local_f0._M_allocated_capacity._0_4_) + 1);
        }
        Specification::LSTMParams::~LSTMParams(&local_70);
        bVar4 = Result::good((Result *)&local_1a0);
        if (bVar4) {
          if (pNVar3->_oneof_case_[0] == 0x1ae) {
            LVar6 = pNVar3->layer_;
          }
          else {
            LVar6.bidirectionallstm_ =
                 Specification::BiDirectionalLSTMLayerParams::default_instance();
          }
          Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
                    ((BiDirectionalLSTMLayerParams *)local_108,LVar6.bidirectionallstm_);
          pLVar10 = local_b0;
          if (local_b0 == (LSTMParams *)0x0) {
            pLVar10 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
          }
          Specification::LSTMParams::LSTMParams(&local_50,pLVar10);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_130._M_string_length = 0;
          local_130.field_2._M_local_buf[0] = '\0';
          if (local_f0._M_allocated_capacity._0_4_ == 3) {
            if (local_d8 != 3) {
              std::operator+(&local_1e0,"Bidirectional LSTM layer:",(local_178->name_).ptr_);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
              goto LAB_0054723e;
            }
            local_170 = local_a0;
            local_138 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                                  (&local_c8,0);
            local_140 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                                  (&local_c8,1);
            pWVar9 = local_138->inputgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e0,"Bidirectional LSTM","");
            psVar2 = (local_178->name_).ptr_;
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1c0,"forward input gate weight matrix","");
            expectedUnits = local_a8 * local_170;
            validateGeneralWeightParams
                      ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                       &local_1c0);
            local_1a0 = (_func_int **)local_168;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
            if (local_160._M_p != local_158 + 8) {
              operator_delete(local_160._M_p,local_158._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_1a0);
            if (bVar4) {
              pWVar9 = local_138->forgetgateweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward forget gate weight matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                         &local_1c0);
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->blockinputweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward block input gate weight matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                         &local_1c0);
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->outputgateweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward output gate weight matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                         &local_1c0);
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->inputgaterecursionmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward input gate recursion matrix","");
              local_110 = local_170 * local_170;
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,&local_1c0
                        );
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->forgetgaterecursionmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward forget gate recursion matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,&local_1c0
                        );
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->blockinputrecursionmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward block input gate recursion matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,&local_1c0
                        );
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_138->outputgaterecursionmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"forward output gate recursion matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,&local_1c0
                        );
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (!bVar4) goto LAB_005472f2;
              pWVar9 = local_140->inputgateweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"Bidirectional LSTM","");
              psVar2 = (local_178->name_).ptr_;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1c0,"backward input gate weight matrix","");
              validateGeneralWeightParams
                        ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                         &local_1c0);
              local_1a0 = (_func_int **)local_168;
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_1a0);
              if (bVar4) {
                pWVar9 = local_140->forgetgateweightmatrix_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e0,"Bidirectional LSTM","");
                psVar2 = (local_178->name_).ptr_;
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1c0,"backward forget gate weight matrix","");
                validateGeneralWeightParams
                          ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                           &local_1c0);
                local_1a0 = (_func_int **)local_168;
                std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
                if (local_160._M_p != local_158 + 8) {
                  operator_delete(local_160._M_p,local_158._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                  operator_delete(local_1c0._M_dataplus._M_p,
                                  local_1c0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p,
                                  local_1e0.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good((Result *)&local_1a0);
                if (bVar4) {
                  pWVar9 = local_140->blockinputweightmatrix_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1e0,"Bidirectional LSTM","");
                  psVar2 = (local_178->name_).ptr_;
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1c0,"backward block input gate weight matrix","");
                  validateGeneralWeightParams
                            ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                             &local_1c0);
                  local_1a0 = (_func_int **)local_168;
                  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
                  if (local_160._M_p != local_158 + 8) {
                    operator_delete(local_160._M_p,local_158._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                    operator_delete(local_1e0._M_dataplus._M_p,
                                    local_1e0.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good((Result *)&local_1a0);
                  if (bVar4) {
                    pWVar9 = local_140->outputgateweightmatrix_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1e0,"Bidirectional LSTM","");
                    psVar2 = (local_178->name_).ptr_;
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1c0,"backward output gate weight matrix","");
                    validateGeneralWeightParams
                              ((Result *)local_168,pWVar9,expectedUnits,local_170,&local_1e0,psVar2,
                               &local_1c0);
                    local_1a0 = (_func_int **)local_168;
                    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
                    if (local_160._M_p != local_158 + 8) {
                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p,
                                      local_1c0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                      operator_delete(local_1e0._M_dataplus._M_p,
                                      local_1e0.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good((Result *)&local_1a0);
                    if (bVar4) {
                      pWVar9 = local_140->inputgaterecursionmatrix_;
                      if (pWVar9 == (WeightParams *)0x0) {
                        pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1e0,"Bidirectional LSTM","");
                      psVar2 = (local_178->name_).ptr_;
                      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1c0,"backward input gate recursion matrix","");
                      validateGeneralWeightParams
                                ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,
                                 &local_1c0);
                      local_1a0 = (_func_int **)local_168;
                      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
                      if (local_160._M_p != local_158 + 8) {
                        operator_delete(local_160._M_p,local_158._8_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                        operator_delete(local_1c0._M_dataplus._M_p,
                                        local_1c0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                        operator_delete(local_1e0._M_dataplus._M_p,
                                        local_1e0.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good((Result *)&local_1a0);
                      if (bVar4) {
                        pWVar9 = local_140->forgetgaterecursionmatrix_;
                        if (pWVar9 == (WeightParams *)0x0) {
                          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                        }
                        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1e0,"Bidirectional LSTM","");
                        psVar2 = (local_178->name_).ptr_;
                        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1c0,"backward forget gate recursion matrix","");
                        validateGeneralWeightParams
                                  ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,psVar2,
                                   &local_1c0);
                        local_1a0 = (_func_int **)local_168;
                        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160);
                        if (local_160._M_p != local_158 + 8) {
                          operator_delete(local_160._M_p,local_158._8_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                          operator_delete(local_1c0._M_dataplus._M_p,
                                          local_1c0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                          operator_delete(local_1e0._M_dataplus._M_p,
                                          local_1e0.field_2._M_allocated_capacity + 1);
                        }
                        bVar4 = Result::good((Result *)&local_1a0);
                        if (bVar4) {
                          pWVar9 = local_140->blockinputrecursionmatrix_;
                          if (pWVar9 == (WeightParams *)0x0) {
                            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_
                            ;
                          }
                          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1e0,"Bidirectional LSTM","");
                          psVar2 = (local_178->name_).ptr_;
                          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1c0,
                                     "backward block input gate recursion matrix","");
                          validateGeneralWeightParams
                                    ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,
                                     psVar2,&local_1c0);
                          local_1a0 = (_func_int **)local_168;
                          std::__cxx11::string::operator=((string *)&local_198,(string *)&local_160)
                          ;
                          if (local_160._M_p != local_158 + 8) {
                            operator_delete(local_160._M_p,local_158._8_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                            operator_delete(local_1c0._M_dataplus._M_p,
                                            local_1c0.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                            operator_delete(local_1e0._M_dataplus._M_p,
                                            local_1e0.field_2._M_allocated_capacity + 1);
                          }
                          bVar4 = Result::good((Result *)&local_1a0);
                          if (bVar4) {
                            pWVar9 = local_140->outputgaterecursionmatrix_;
                            if (pWVar9 == (WeightParams *)0x0) {
                              pWVar9 = (WeightParams *)
                                       &Specification::_WeightParams_default_instance_;
                            }
                            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1e0,"Bidirectional LSTM","");
                            psVar2 = (local_178->name_).ptr_;
                            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1c0,"backward output gate recursion matrix",
                                       "");
                            validateGeneralWeightParams
                                      ((Result *)local_168,pWVar9,local_110,local_170,&local_1e0,
                                       psVar2,&local_1c0);
                            local_1a0 = (_func_int **)local_168;
                            std::__cxx11::string::operator=
                                      ((string *)&local_198,(string *)&local_160);
                            if (local_160._M_p != local_158 + 8) {
                              operator_delete(local_160._M_p,local_158._8_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                              operator_delete(local_1c0._M_dataplus._M_p,
                                              local_1c0.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                              operator_delete(local_1e0._M_dataplus._M_p,
                                              local_1e0.field_2._M_allocated_capacity + 1);
                            }
                            bVar4 = Result::good((Result *)&local_1a0);
                            if (bVar4) {
                              pLVar10 = local_b0;
                              if (local_b0 == (LSTMParams *)0x0) {
                                pLVar10 = (LSTMParams *)
                                          &Specification::_LSTMParams_default_instance_;
                              }
                              if (pLVar10->hasbiasvectors_ == true) {
                                pWVar9 = local_138->inputgatebiasvector_;
                                if (pWVar9 == (WeightParams *)0x0) {
                                  pWVar9 = (WeightParams *)
                                           &Specification::_WeightParams_default_instance_;
                                }
                                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1e0,"Bidirectional LSTM","");
                                psVar2 = (local_178->name_).ptr_;
                                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1c0,"forward input gate bias vector","")
                                ;
                                validateGeneralWeightParams
                                          ((Result *)local_168,pWVar9,local_170,1,&local_1e0,psVar2,
                                           &local_1c0);
                                local_1a0 = (_func_int **)local_168;
                                std::__cxx11::string::operator=
                                          ((string *)&local_198,(string *)&local_160);
                                if (local_160._M_p != local_158 + 8) {
                                  operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                  operator_delete(local_1c0._M_dataplus._M_p,
                                                  local_1c0.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                  operator_delete(local_1e0._M_dataplus._M_p,
                                                  local_1e0.field_2._M_allocated_capacity + 1);
                                }
                                bVar4 = Result::good((Result *)&local_1a0);
                                if (bVar4) {
                                  pWVar9 = local_138->forgetgatebiasvector_;
                                  if (pWVar9 == (WeightParams *)0x0) {
                                    pWVar9 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1e0,"Bidirectional LSTM","");
                                  psVar2 = (local_178->name_).ptr_;
                                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1c0,"forward forget gate bias vector",
                                             "");
                                  validateGeneralWeightParams
                                            ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                             psVar2,&local_1c0);
                                  local_1a0 = (_func_int **)local_168;
                                  std::__cxx11::string::operator=
                                            ((string *)&local_198,(string *)&local_160);
                                  if (local_160._M_p != local_158 + 8) {
                                    operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                    operator_delete(local_1c0._M_dataplus._M_p,
                                                    local_1c0.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                    operator_delete(local_1e0._M_dataplus._M_p,
                                                    local_1e0.field_2._M_allocated_capacity + 1);
                                  }
                                  bVar4 = Result::good((Result *)&local_1a0);
                                  if (bVar4) {
                                    pWVar9 = local_138->blockinputbiasvector_;
                                    if (pWVar9 == (WeightParams *)0x0) {
                                      pWVar9 = (WeightParams *)
                                               &Specification::_WeightParams_default_instance_;
                                    }
                                    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1e0,"Bidirectional LSTM","");
                                    psVar2 = (local_178->name_).ptr_;
                                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1c0,
                                               "forward block input bias vector","");
                                    validateGeneralWeightParams
                                              ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                               psVar2,&local_1c0);
                                    local_1a0 = (_func_int **)local_168;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_198,(string *)&local_160);
                                    if (local_160._M_p != local_158 + 8) {
                                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                      operator_delete(local_1c0._M_dataplus._M_p,
                                                      local_1c0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                      operator_delete(local_1e0._M_dataplus._M_p,
                                                      local_1e0.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar4 = Result::good((Result *)&local_1a0);
                                    if (bVar4) {
                                      pWVar9 = local_138->outputgatebiasvector_;
                                      if (pWVar9 == (WeightParams *)0x0) {
                                        pWVar9 = (WeightParams *)
                                                 &Specification::_WeightParams_default_instance_;
                                      }
                                      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1e0,"Bidirectional LSTM","");
                                      psVar2 = (local_178->name_).ptr_;
                                      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1c0,
                                                 "forward output gate bias vector","");
                                      validateGeneralWeightParams
                                                ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                                 psVar2,&local_1c0);
                                      local_1a0 = (_func_int **)local_168;
                                      std::__cxx11::string::operator=
                                                ((string *)&local_198,(string *)&local_160);
                                      if (local_160._M_p != local_158 + 8) {
                                        operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                        operator_delete(local_1c0._M_dataplus._M_p,
                                                        local_1c0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                        operator_delete(local_1e0._M_dataplus._M_p,
                                                        local_1e0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      bVar4 = Result::good((Result *)&local_1a0);
                                      if (bVar4) {
                                        pWVar9 = local_140->inputgatebiasvector_;
                                        if (pWVar9 == (WeightParams *)0x0) {
                                          pWVar9 = (WeightParams *)
                                                   &Specification::_WeightParams_default_instance_;
                                        }
                                        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1e0,"Bidirectional LSTM","");
                                        psVar2 = (local_178->name_).ptr_;
                                        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1c0,
                                                   "backward input gate bias vector","");
                                        validateGeneralWeightParams
                                                  ((Result *)local_168,pWVar9,local_170,1,&local_1e0
                                                   ,psVar2,&local_1c0);
                                        local_1a0 = (_func_int **)local_168;
                                        std::__cxx11::string::operator=
                                                  ((string *)&local_198,(string *)&local_160);
                                        if (local_160._M_p != local_158 + 8) {
                                          operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                          operator_delete(local_1c0._M_dataplus._M_p,
                                                          local_1c0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                          operator_delete(local_1e0._M_dataplus._M_p,
                                                          local_1e0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good((Result *)&local_1a0);
                                        if (bVar4) {
                                          pWVar9 = local_140->forgetgatebiasvector_;
                                          if (pWVar9 == (WeightParams *)0x0) {
                                            pWVar9 = (WeightParams *)
                                                     &Specification::_WeightParams_default_instance_
                                            ;
                                          }
                                          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_1e0,"Bidirectional LSTM","");
                                          psVar2 = (local_178->name_).ptr_;
                                          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_1c0,
                                                     "backward forget gate bias vector","");
                                          validateGeneralWeightParams
                                                    ((Result *)local_168,pWVar9,local_170,1,
                                                     &local_1e0,psVar2,&local_1c0);
                                          local_1a0 = (_func_int **)local_168;
                                          std::__cxx11::string::operator=
                                                    ((string *)&local_198,(string *)&local_160);
                                          if (local_160._M_p != local_158 + 8) {
                                            operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                            operator_delete(local_1c0._M_dataplus._M_p,
                                                            local_1c0.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                            operator_delete(local_1e0._M_dataplus._M_p,
                                                            local_1e0.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          bVar4 = Result::good((Result *)&local_1a0);
                                          if (bVar4) {
                                            pWVar9 = local_140->blockinputbiasvector_;
                                            if (pWVar9 == (WeightParams *)0x0) {
                                              pWVar9 = (WeightParams *)
                                                       &Specification::
                                                        _WeightParams_default_instance_;
                                            }
                                            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_1e0,"Bidirectional LSTM","")
                                            ;
                                            psVar2 = (local_178->name_).ptr_;
                                            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_1c0,
                                                       "backward block input bias vector","");
                                            validateGeneralWeightParams
                                                      ((Result *)local_168,pWVar9,local_170,1,
                                                       &local_1e0,psVar2,&local_1c0);
                                            local_1a0 = (_func_int **)local_168;
                                            std::__cxx11::string::operator=
                                                      ((string *)&local_198,(string *)&local_160);
                                            if (local_160._M_p != local_158 + 8) {
                                              operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)
                                            {
                                              operator_delete(local_1c0._M_dataplus._M_p,
                                                              local_1c0.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)
                                            {
                                              operator_delete(local_1e0._M_dataplus._M_p,
                                                              local_1e0.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                            bVar4 = Result::good((Result *)&local_1a0);
                                            if (bVar4) {
                                              pWVar9 = local_140->outputgatebiasvector_;
                                              if (pWVar9 == (WeightParams *)0x0) {
                                                pWVar9 = (WeightParams *)
                                                         &Specification::
                                                          _WeightParams_default_instance_;
                                              }
                                              local_1e0._M_dataplus._M_p =
                                                   (pointer)&local_1e0.field_2;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_1e0,"Bidirectional LSTM",
                                                         "");
                                              psVar2 = (local_178->name_).ptr_;
                                              local_1c0._M_dataplus._M_p =
                                                   (pointer)&local_1c0.field_2;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_1c0,
                                                         "backward output gate bias vector","");
                                              validateGeneralWeightParams
                                                        ((Result *)local_168,pWVar9,local_170,1,
                                                         &local_1e0,psVar2,&local_1c0);
                                              local_1a0 = (_func_int **)local_168;
                                              std::__cxx11::string::operator=
                                                        ((string *)&local_198,(string *)&local_160);
                                              if (local_160._M_p != local_158 + 8) {
                                                operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1c0._M_dataplus._M_p != &local_1c0.field_2
                                                 ) {
                                                operator_delete(local_1c0._M_dataplus._M_p,
                                                                local_1c0.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1e0._M_dataplus._M_p != &local_1e0.field_2
                                                 ) {
                                                operator_delete(local_1e0._M_dataplus._M_p,
                                                                local_1e0.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              bVar4 = Result::good((Result *)&local_1a0);
                                              if (bVar4) goto LAB_00546add;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
LAB_00546add:
                                if (local_b0 == (LSTMParams *)0x0) {
                                  local_b0 = (LSTMParams *)
                                             &Specification::_LSTMParams_default_instance_;
                                }
                                if (local_b0->haspeepholevectors_ == true) {
                                  pWVar9 = local_138->inputgatepeepholevector_;
                                  if (pWVar9 == (WeightParams *)0x0) {
                                    pWVar9 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1e0,"Bidirectional LSTM","");
                                  psVar2 = (local_178->name_).ptr_;
                                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1c0,
                                             "forward input gate peephole vector","");
                                  validateGeneralWeightParams
                                            ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                             psVar2,&local_1c0);
                                  local_1a0 = (_func_int **)local_168;
                                  std::__cxx11::string::operator=
                                            ((string *)&local_198,(string *)&local_160);
                                  if (local_160._M_p != local_158 + 8) {
                                    operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                    operator_delete(local_1c0._M_dataplus._M_p,
                                                    local_1c0.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                    operator_delete(local_1e0._M_dataplus._M_p,
                                                    local_1e0.field_2._M_allocated_capacity + 1);
                                  }
                                  bVar4 = Result::good((Result *)&local_1a0);
                                  if (bVar4) {
                                    pWVar9 = local_138->forgetgatepeepholevector_;
                                    if (pWVar9 == (WeightParams *)0x0) {
                                      pWVar9 = (WeightParams *)
                                               &Specification::_WeightParams_default_instance_;
                                    }
                                    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1e0,"Bidirectional LSTM","");
                                    psVar2 = (local_178->name_).ptr_;
                                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1c0,
                                               "forward forget gate peephole vector","");
                                    validateGeneralWeightParams
                                              ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                               psVar2,&local_1c0);
                                    local_1a0 = (_func_int **)local_168;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_198,(string *)&local_160);
                                    if (local_160._M_p != local_158 + 8) {
                                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                      operator_delete(local_1c0._M_dataplus._M_p,
                                                      local_1c0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                      operator_delete(local_1e0._M_dataplus._M_p,
                                                      local_1e0.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar4 = Result::good((Result *)&local_1a0);
                                    if (bVar4) {
                                      pWVar9 = local_138->outputgatepeepholevector_;
                                      if (pWVar9 == (WeightParams *)0x0) {
                                        pWVar9 = (WeightParams *)
                                                 &Specification::_WeightParams_default_instance_;
                                      }
                                      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1e0,"Bidirectional LSTM","");
                                      psVar2 = (local_178->name_).ptr_;
                                      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1c0,
                                                 "forward output gate peephole vector","");
                                      validateGeneralWeightParams
                                                ((Result *)local_168,pWVar9,local_170,1,&local_1e0,
                                                 psVar2,&local_1c0);
                                      local_1a0 = (_func_int **)local_168;
                                      std::__cxx11::string::operator=
                                                ((string *)&local_198,(string *)&local_160);
                                      if (local_160._M_p != local_158 + 8) {
                                        operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                        operator_delete(local_1c0._M_dataplus._M_p,
                                                        local_1c0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                        operator_delete(local_1e0._M_dataplus._M_p,
                                                        local_1e0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      bVar4 = Result::good((Result *)&local_1a0);
                                      if (bVar4) {
                                        pWVar9 = local_140->inputgatepeepholevector_;
                                        if (pWVar9 == (WeightParams *)0x0) {
                                          pWVar9 = (WeightParams *)
                                                   &Specification::_WeightParams_default_instance_;
                                        }
                                        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1e0,"Bidirectional LSTM","");
                                        psVar2 = (local_178->name_).ptr_;
                                        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1c0,
                                                   "backward input gate peephole vector","");
                                        validateGeneralWeightParams
                                                  ((Result *)local_168,pWVar9,local_170,1,&local_1e0
                                                   ,psVar2,&local_1c0);
                                        local_1a0 = (_func_int **)local_168;
                                        std::__cxx11::string::operator=
                                                  ((string *)&local_198,(string *)&local_160);
                                        if (local_160._M_p != local_158 + 8) {
                                          operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                          operator_delete(local_1c0._M_dataplus._M_p,
                                                          local_1c0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                          operator_delete(local_1e0._M_dataplus._M_p,
                                                          local_1e0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good((Result *)&local_1a0);
                                        if (bVar4) {
                                          pWVar9 = local_140->forgetgatepeepholevector_;
                                          if (pWVar9 == (WeightParams *)0x0) {
                                            pWVar9 = (WeightParams *)
                                                     &Specification::_WeightParams_default_instance_
                                            ;
                                          }
                                          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_1e0,"Bidirectional LSTM","");
                                          psVar2 = (local_178->name_).ptr_;
                                          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_1c0,
                                                     "backward forget gate peephole vector","");
                                          validateGeneralWeightParams
                                                    ((Result *)local_168,pWVar9,local_170,1,
                                                     &local_1e0,psVar2,&local_1c0);
                                          local_1a0 = (_func_int **)local_168;
                                          std::__cxx11::string::operator=
                                                    ((string *)&local_198,(string *)&local_160);
                                          if (local_160._M_p != local_158 + 8) {
                                            operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                                            operator_delete(local_1c0._M_dataplus._M_p,
                                                            local_1c0.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                                            operator_delete(local_1e0._M_dataplus._M_p,
                                                            local_1e0.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          bVar4 = Result::good((Result *)&local_1a0);
                                          if (bVar4) {
                                            pWVar9 = local_140->outputgatepeepholevector_;
                                            if (pWVar9 == (WeightParams *)0x0) {
                                              pWVar9 = (WeightParams *)
                                                       &Specification::
                                                        _WeightParams_default_instance_;
                                            }
                                            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_1e0,"Bidirectional LSTM","")
                                            ;
                                            psVar2 = (local_178->name_).ptr_;
                                            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_1c0,
                                                       "backward output gate peephole vector","");
                                            validateGeneralWeightParams
                                                      ((Result *)local_168,pWVar9,local_170,1,
                                                       &local_1e0,psVar2,&local_1c0);
                                            local_1a0 = (_func_int **)local_168;
                                            std::__cxx11::string::operator=
                                                      ((string *)&local_198,(string *)&local_160);
                                            if (local_160._M_p != local_158 + 8) {
                                              operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)
                                            {
                                              operator_delete(local_1c0._M_dataplus._M_p,
                                                              local_1c0.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)
                                            {
                                              operator_delete(local_1e0._M_dataplus._M_p,
                                                              local_1e0.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                            Result::good((Result *)&local_1a0);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              *(_func_int ***)__return_storage_ptr__ = local_1a0;
              paVar1 = &(__return_storage_ptr__->m_message).field_2;
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_p == &local_188) {
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
                *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                     local_188._8_8_;
              }
              else {
                (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_198._M_p;
                (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                     CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
              }
            }
            else {
LAB_005472f2:
              *(_func_int ***)__return_storage_ptr__ = local_1a0;
              paVar1 = &(__return_storage_ptr__->m_message).field_2;
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_p == &local_188) {
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
                *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                     local_188._8_8_;
              }
              else {
                (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_198._M_p;
                (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                     CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
              }
            }
            local_198._M_p = (pointer)&local_188;
            (__return_storage_ptr__->m_message)._M_string_length = local_190;
            local_190 = 0;
            local_188._M_local_buf[0] = '\0';
          }
          else {
            std::operator+(&local_1e0,"Bidirectional LSTM layer:",(local_178->name_).ptr_);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
LAB_0054723e:
            psVar8 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar8) {
              local_158._0_8_ = *psVar8;
              local_158._8_8_ = plVar7[3];
              local_168 = (undefined1  [8])local_158;
            }
            else {
              local_158._0_8_ = *psVar8;
              local_168 = (undefined1  [8])*plVar7;
            }
            local_160._M_p = (pointer)plVar7[1];
            *plVar7 = (long)psVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_130,(string *)local_168);
            if (local_168 != (undefined1  [8])local_158) {
              operator_delete((void *)local_168,local_158._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
          Specification::LSTMParams::~LSTMParams(&local_50);
          Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
                    ((BiDirectionalLSTMLayerParams *)local_108);
          goto LAB_00544f45;
        }
      }
    }
  }
  *(_func_int ***)__return_storage_ptr__ = local_1a0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p == &local_188) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_188._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_198._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_190;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_198._M_p = (pointer)&local_188;
LAB_00544f45:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,
                    CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 5);
    if (r.good()) {
        r = validateOutputCount(layer, 5, 5);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate weight matrix");
    if(!r.good()) return r;
    // Check forward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix");
    if(!r.good()) return r;
    // Check backward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate weight matrix");
    if(!r.good()) return r;
    // Check backward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix");
    if(!r.good()) return r;

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate peephole vector");
        if(!r.good()) return r;
    }
    return r;
}